

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

int show_current_example_proc(Am_Object *self)

{
  char cVar1;
  ushort uVar2;
  Am_Value *pAVar3;
  ulong uVar4;
  Am_Object *pAVar5;
  Am_Object example;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  pAVar3 = (Am_Value *)Am_Object::Get(0x530,0x169);
  Am_Object::Am_Object(&local_30,pAVar3);
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    Am_Object::Am_Object(&local_18,&gesture_shown);
    Am_Object::Remove_Part((Am_Object)self);
    Am_Object::~Am_Object(&local_18);
  }
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    Am_Object::operator=(&gesture_shown,(Am_Object_Data *)0x0);
  }
  else {
    Am_Object::Copy((char *)&local_20);
    uVar4 = Am_Object::Get(0x540,0x66);
    uVar2 = Am_Object::Set((ushort)&local_20,(Am_Value *)0x66,uVar4);
    uVar4 = Am_Object::Get(0x540,0x67);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Value *)0x67,uVar4);
    Am_Object::operator=(&gesture_shown,pAVar5);
    Am_Object::~Am_Object(&local_20);
    Am_Object::Am_Object(&local_28,&gesture_shown);
    Am_Object::Add_Part((Am_Object)self,SUB81(&local_28,0),1);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Object::~Am_Object(&local_30);
  return 1;
}

Assistant:

Am_Define_Formula(int, show_current_example)
{
  Am_Object example = example_panel.Get(Am_VALUE);

  if (gesture_shown.Valid())
    self.Remove_Part(gesture_shown);

  if (example.Valid()) {
    gesture_shown = example.Copy()
                        .Set(Am_WIDTH, gesture_frame.Get(Am_WIDTH))
                        .Set(Am_HEIGHT, gesture_frame.Get(Am_HEIGHT));
    self.Add_Part(gesture_shown);
  } else
    gesture_shown = nullptr;

  return 1;
}